

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O0

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddCallApplyTargetInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          ProfileId callApplyCallSiteId,FunctionInfo *inlinee)

{
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  ProfileId PVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> **ppWVar6;
  Recycler *pRVar7;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *ptr;
  FunctionCodeGenJitTimeData **ppFVar8;
  FunctionCodeGenJitTimeData *ptr_00;
  FunctionCodeGenJitTimeData *inlineeData;
  TrackAllocData local_58;
  FunctionBody *local_30;
  FunctionBody *functionBody;
  FunctionInfo *inlinee_local;
  ProfileId callApplyCallSiteId_local;
  Recycler *pRStack_18;
  ProfileId profiledCallSiteId_local;
  Recycler *recycler_local;
  FunctionCodeGenJitTimeData *this_local;
  
  functionBody = (FunctionBody *)inlinee;
  inlinee_local._4_2_ = callApplyCallSiteId;
  inlinee_local._6_2_ = profiledCallSiteId;
  pRStack_18 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xd8,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_30 = GetFunctionBody(this);
  if (local_30 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xda,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar2 = inlinee_local._6_2_;
  PVar4 = FunctionBody::GetProfiledCallSiteCount(local_30);
  if (PVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdb,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar2 = inlinee_local._4_2_;
  PVar4 = FunctionBody::GetProfiledCallApplyCallSiteCount(local_30);
  if (PVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdc,
                                "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                ,
                                "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdd,"(inlinee != nullptr)","inlinee != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->callApplyTargetInlinees);
  pRVar7 = pRStack_18;
  if (*ppWVar6 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    PVar4 = FunctionBody::GetProfiledCallApplyCallSiteCount(local_30);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,
               (type_info *)&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo,0,
               (ulong)PVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
               ,0xe1);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_58);
    PVar4 = FunctionBody::GetProfiledCallApplyCallSiteCount(local_30);
    ptr = Memory::
          AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>,false>
                    ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)PVar4);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::operator=
              (&this->callApplyTargetInlinees,ptr);
  }
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->callApplyTargetInlinees);
  ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenJitTimeData__
                      ((WriteBarrierPtr *)(*ppWVar6 + inlinee_local._4_2_));
  if (*ppFVar8 != (FunctionCodeGenJitTimeData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xe5,"(callApplyTargetInlinees[callApplyCallSiteId] == nullptr)",
                                "callApplyTargetInlinees[callApplyCallSiteId] == nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ptr_00 = New(pRStack_18,(FunctionInfo *)functionBody,(EntryPointInfo *)0x0,true);
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->callApplyTargetInlinees);
  Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::operator=
            (*ppWVar6 + inlinee_local._4_2_,ptr_00);
  return ptr_00;
}

Assistant:

FunctionCodeGenJitTimeData * FunctionCodeGenJitTimeData::AddCallApplyTargetInlinee(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        const ProfileId callApplyCallSiteId,
        FunctionInfo *const inlinee)
    {
        Assert(recycler != nullptr);
        FunctionBody * functionBody = GetFunctionBody();
        Assert(functionBody != nullptr);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());
        Assert(inlinee != nullptr);

        if (!callApplyTargetInlinees)
        {
            callApplyTargetInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData *), functionBody->GetProfiledCallApplyCallSiteCount());
        }

        // Polymorphic call/apply targets are not inlined.
        Assert(callApplyTargetInlinees[callApplyCallSiteId] == nullptr);

        FunctionCodeGenJitTimeData * inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, true /*isInlined*/);
        callApplyTargetInlinees[callApplyCallSiteId] = inlineeData;
        return inlineeData;
    }